

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gzio.cc
# Opt level: O0

void __thiscall gzip_readwrite_Test::TestBody(gzip_readwrite_Test *this)

{
  byte *pbVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  off64_t oVar5;
  AssertHelper *this_00;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  int err;
  gzFile file;
  int64_t pos;
  size_t read;
  uint32_t uncompr_len;
  uint32_t compr_len;
  uint8_t uncompr [128];
  uint8_t compr [128];
  undefined4 in_stack_fffffffffffff798;
  uint in_stack_fffffffffffff79c;
  gzFile in_stack_fffffffffffff7a0;
  gzFile in_stack_fffffffffffff7a8;
  AssertionResult *pAVar6;
  int in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b4;
  undefined4 uVar7;
  gzFile in_stack_fffffffffffff7b8;
  int line;
  char *in_stack_fffffffffffff7c0;
  int *errnum;
  gzFile in_stack_fffffffffffff7c8;
  Type TVar8;
  undefined7 in_stack_fffffffffffff7d0;
  undefined1 in_stack_fffffffffffff7d7;
  char *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  char *in_stack_fffffffffffff810;
  AssertionResult *in_stack_fffffffffffff818;
  AssertionResult *pAVar9;
  undefined7 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff827;
  uint local_70c;
  AssertionResult local_5a8 [2];
  undefined4 local_584;
  AssertionResult local_580 [2];
  undefined4 local_55c;
  AssertionResult local_558 [2];
  int local_534;
  AssertionResult local_530 [2];
  undefined4 local_50c;
  AssertionResult local_508 [2];
  AssertionResult local_4e8 [2];
  undefined4 local_4c8;
  int32_t local_4c4;
  AssertionResult local_4c0 [2];
  off64_t local_4a0;
  AssertionResult local_498 [2];
  undefined4 local_474;
  AssertionResult local_470 [2];
  AssertionResult local_450 [2];
  undefined8 local_430;
  size_t local_428;
  AssertionResult local_420 [2];
  undefined1 local_3fd;
  int32_t local_3fc;
  AssertionResult local_3f8 [2];
  undefined1 local_3d5;
  uint local_3d4;
  AssertionResult local_3d0 [2];
  off64_t local_3b0;
  AssertionResult local_3a8 [2];
  undefined4 local_384;
  AssertionResult local_380 [2];
  undefined4 local_360;
  int32_t local_35c;
  AssertionResult local_358 [2];
  AssertionResult local_338 [2];
  undefined4 local_318;
  int32_t local_314;
  AssertionResult local_310;
  string local_300 [55];
  undefined1 local_2c9;
  AssertionResult local_2c8 [2];
  undefined8 local_2a8;
  AssertionResult local_2a0 [2];
  undefined4 local_280;
  int32_t local_27c;
  AssertionResult local_278 [2];
  undefined8 local_258;
  size_t local_250;
  AssertionResult local_248 [2];
  undefined4 local_228;
  int32_t local_224;
  AssertionResult local_220 [2];
  undefined4 local_1fc;
  off64_t local_1f8;
  AssertionResult local_1f0 [2];
  undefined4 local_1d0;
  int32_t local_1cc;
  AssertionResult local_1c8 [2];
  undefined4 local_1a8;
  int32_t local_1a4;
  AssertionResult local_1a0;
  uint local_18c;
  string local_188 [71];
  undefined1 local_141;
  AssertionResult local_140;
  int local_12c;
  gzFile local_128;
  off64_t local_120;
  size_t local_118;
  undefined4 local_110;
  int local_10c;
  char local_108 [264];
  
  local_10c = 0x80;
  local_110 = 0x80;
  local_128 = zng_gzopen((char *)in_stack_fffffffffffff7a0,
                         (char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  local_141 = local_128 != (gzFile)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff7a0,
             (bool *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),(type *)0x13b674)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff818,in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
               (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
               (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (Message *)in_stack_fffffffffffff818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
    std::__cxx11::string::~string(local_188);
    testing::Message::~Message((Message *)0x13b75e);
  }
  local_18c = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b7ef);
  if (local_18c == 0) {
    zng_gzputc(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b4);
    local_1a4 = zng_gzputs(in_stack_fffffffffffff7b8,
                           (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    local_1a8 = 4;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff7b8,
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x13b8db);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      testing::Message::~Message((Message *)0x13b93e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b996);
    local_1cc = zng_gzprintf(local_128,", %s!","hello");
    local_1d0 = 8;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff7b8,
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x13ba67);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      testing::Message::~Message((Message *)0x13baca);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bb22);
    local_1f8 = zng_gzseek(in_stack_fffffffffffff7b8,
                           CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                           (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20));
    local_1fc = 0;
    testing::internal::CmpHelperGE<long,int>
              ((char *)in_stack_fffffffffffff7b8,
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (long *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_1f0);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x13bbee);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      testing::Message::~Message((Message *)0x13bc51);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bca9);
    local_224 = zng_gzsetparams(in_stack_fffffffffffff7a8,
                                (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20),
                                (int)in_stack_fffffffffffff7a0);
    local_228 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff7b8,
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_220);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x13bd71);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      testing::Message::~Message((Message *)0x13bdd4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13be2c);
    local_250 = zng_gzfwrite(in_stack_fffffffffffff7c8,(size_t)in_stack_fffffffffffff7c0,
                             (size_t)in_stack_fffffffffffff7b8,
                             (gzFile)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    local_258 = 0;
    testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffff7b8,
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (unsigned_long *)in_stack_fffffffffffff7a8,(unsigned_long *)in_stack_fffffffffffff7a0
              );
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_248);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x13bf00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      testing::Message::~Message((Message *)0x13bf63);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13bfbb);
    local_27c = zng_gzflush(in_stack_fffffffffffff7a8,
                            (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
    local_280 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff7b8,
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_278);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x13c081);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      testing::Message::~Message((Message *)0x13c0e4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c13c);
    oVar5 = zng_gzoffset(in_stack_fffffffffffff7a8);
    local_10c = (int)oVar5;
    local_2a8 = 0;
    testing::internal::CmpHelperGE<unsigned_int,unsigned_long>
              ((char *)in_stack_fffffffffffff7b8,
               (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               &in_stack_fffffffffffff7a8->have,(unsigned_long *)in_stack_fffffffffffff7a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x13c1fe);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      testing::Message::~Message((Message *)0x13c261);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c2b9);
    zng_gzclose(in_stack_fffffffffffff7a8);
    local_128 = zng_gzopen((char *)in_stack_fffffffffffff7a0,
                           (char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    local_2c9 = local_128 != (gzFile)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff7a0,
               (bool *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
               (type *)0x13c315);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                 (char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                 (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                 (Message *)in_stack_fffffffffffff818);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
      std::__cxx11::string::~string(local_300);
      testing::Message::~Message((Message *)0x13c411);
    }
    local_18c = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c4a2);
    if (local_18c == 0) {
      strcpy(local_108,"garbages");
      local_314 = zng_gzread(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                             in_stack_fffffffffffff79c);
      local_318 = 0x1c;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_310);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13c5a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13c603);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c658);
      testing::internal::CmpHelperSTREQ
                (&in_stack_fffffffffffff818->success_,in_stack_fffffffffffff810,
                 (char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_338);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13c6f9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13c75c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c7b4);
      local_35c = zng_gzeof(local_128);
      local_360 = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_358);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13c875);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13c8d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c930);
      local_120 = zng_gzseek(in_stack_fffffffffffff7b8,
                             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                             (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20));
      local_384 = 6;
      testing::internal::EqHelper::Compare<long,_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (long *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_380);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13c9fe);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13ca61);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13cab6);
      local_3b0 = zng_gztell(local_128);
      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (long *)in_stack_fffffffffffff7a8,(long *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13cb6d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13cbd0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13cc28);
      if (local_128->have == 0) {
        local_70c = zng_gzgetc(in_stack_fffffffffffff7a8);
      }
      else {
        local_128->have = local_128->have - 1;
        local_128->pos = local_128->pos + 1;
        pbVar1 = local_128->next;
        local_128->next = pbVar1 + 1;
        local_70c = (uint)*pbVar1;
      }
      local_3d4 = local_70c;
      local_3d5 = 0x20;
      testing::internal::EqHelper::Compare<int,_char,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (int *)in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3d0);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13cd47);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13cdaa);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ce02);
      local_3fc = zng_gzungetc(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      local_3fd = 0x20;
      testing::internal::EqHelper::Compare<int,_char,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (int *)in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13cec5);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13cf28);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13cf80);
      strcpy(local_108,"garbages");
      zng_gzgets(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                 (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20));
      local_428 = strlen(local_108);
      local_430 = 7;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (unsigned_long *)in_stack_fffffffffffff7a8,
                 (unsigned_long *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_420);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13d07b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13d0de);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d133);
      testing::internal::CmpHelperSTREQ
                (&in_stack_fffffffffffff818->success_,in_stack_fffffffffffff810,
                 (char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_450);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13d1d4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13d237);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d28f);
      local_120 = zng_gzseek(in_stack_fffffffffffff7b8,
                             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                             (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20));
      local_474 = 0xe;
      testing::internal::EqHelper::Compare<long,_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (long *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_470);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13d358);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13d3bb);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d410);
      local_4a0 = zng_gztell(local_128);
      pAVar9 = local_498;
      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (long *)in_stack_fffffffffffff7a8,(long *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13d4c7);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13d52a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d582);
      local_4c4 = zng_gzeof(local_128);
      local_4c8 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_4c0);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13d643);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13d6a6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d6fe);
      strcpy(local_108,"garbages");
      local_118 = zng_gzfread(in_stack_fffffffffffff7c8,(size_t)in_stack_fffffffffffff7c0,
                              (size_t)in_stack_fffffffffffff7b8,
                              (gzFile)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0))
      ;
      testing::internal::CmpHelperSTREQ
                (&in_stack_fffffffffffff818->success_,in_stack_fffffffffffff810,
                 (char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_4e8);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13d7e6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   (Message *)in_stack_fffffffffffff818);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13d849);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d8a1);
      local_120 = zng_gzoffset(in_stack_fffffffffffff7a8);
      local_50c = 0;
      pAVar9 = local_508;
      testing::internal::CmpHelperGE<long,int>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (long *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
      if (!(bool)uVar3) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13d963);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff820),(Message *)pAVar9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13d9c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13da15);
      local_534 = local_10c + 10;
      pAVar6 = local_530;
      testing::internal::EqHelper::Compare<long,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (long *)in_stack_fffffffffffff7a8,&in_stack_fffffffffffff7a0->have);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13dabc);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20),in_stack_fffffffffffff7c0,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff820),(Message *)pAVar9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13db19);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13db71);
      zng_gzfread(in_stack_fffffffffffff7c8,(size_t)in_stack_fffffffffffff7c0,
                  (size_t)in_stack_fffffffffffff7b8,
                  (gzFile)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      TVar8 = (Type)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
      zng_gzerror(local_128,&local_12c);
      local_55c = 0;
      testing::internal::CmpHelperNE<int,int>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_558);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x13dc48);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                   TVar8,in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff820),(Message *)pAVar9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13dca5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13dcfd);
      zng_gzclearerr(in_stack_fffffffffffff7a0);
      errnum = &local_12c;
      zng_gzerror(local_128,errnum);
      local_584 = 0;
      pAVar6 = local_580;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0);
      uVar4 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
      TVar8 = (Type)((ulong)pAVar6 >> 0x20);
      if (!(bool)uVar4) {
        testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffff7d0));
        in_stack_fffffffffffff7b8 =
             (gzFile)testing::AssertionResult::failure_message((AssertionResult *)0x13ddc2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff7d0),TVar8,(char *)errnum,
                   (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff820),(Message *)pAVar9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff7a0);
        testing::Message::~Message((Message *)0x13de1f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13de77);
      zng_gzclose(in_stack_fffffffffffff7a8);
      zng_gzclose(in_stack_fffffffffffff7a8);
      pAVar6 = local_5a8;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffff7b8,
                 (char *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),(int *)pAVar6
                 ,(int *)in_stack_fffffffffffff7a0);
      line = (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
      uVar7 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff7b4);
      if (!bVar2) {
        testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffff7d0));
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x13df35);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff7d0),TVar8,(char *)errnum,
                   line,(char *)CONCAT44(uVar7,in_stack_fffffffffffff7b0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff820),(Message *)pAVar9);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x13df92);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13dfe7);
    }
  }
  return;
}

Assistant:

TEST(gzip, readwrite) {
#ifdef NO_GZCOMPRESS
    fprintf(stderr, "NO_GZCOMPRESS -- gz* functions cannot compress\n");
    GTEST_SKIP();
#else
    uint8_t compr[128], uncompr[128];
    uint32_t compr_len = sizeof(compr), uncompr_len = sizeof(uncompr);
    size_t read;
    int64_t pos;
    gzFile file;
    int err;

    Z_UNUSED(compr);
    /* Write gz file with test data */
    file = PREFIX(gzopen)(TESTFILE, "wb");
    ASSERT_TRUE(file != NULL);
    /* Write hello, hello! using gzputs and gzprintf */
    PREFIX(gzputc)(file, 'h');
    EXPECT_EQ(PREFIX(gzputs)(file, "ello"), 4);
    EXPECT_EQ(PREFIX(gzprintf)(file, ", %s!", "hello"), 8);
    /* Write string null-teriminator using gzseek */
    EXPECT_GE(PREFIX(gzseek)(file, 1L, SEEK_CUR), 0);
    /* Write hello, hello! using gzfwrite using best compression level */
    EXPECT_EQ(PREFIX(gzsetparams)(file, Z_BEST_COMPRESSION, Z_DEFAULT_STRATEGY), Z_OK);
    EXPECT_NE(PREFIX(gzfwrite)(hello, hello_len, 1, file), 0UL);
    /* Flush compressed bytes to file */
    EXPECT_EQ(PREFIX(gzflush)(file, Z_SYNC_FLUSH), Z_OK);
    compr_len = (uint32_t)PREFIX(gzoffset)(file);
    EXPECT_GE(compr_len, 0UL);
    PREFIX(gzclose)(file);

    /* Open gz file we previously wrote */
    file = PREFIX(gzopen)(TESTFILE, "rb");
    ASSERT_TRUE(file != NULL);

    /* Read uncompressed data - hello, hello! string twice */
    strcpy((char*)uncompr, "garbages");
    EXPECT_EQ(PREFIX(gzread)(file, uncompr, (unsigned)uncompr_len), (int)(hello_len + hello_len));
    EXPECT_STREQ((char*)uncompr, hello);

    /* Check position at the end of the gz file */
    EXPECT_EQ(PREFIX(gzeof)(file), 1);

    /* Seek backwards mid-string and check char reading with gzgetc and gzungetc */
    pos = PREFIX(gzseek)(file, -22L, SEEK_CUR);
    EXPECT_EQ(pos, 6);
    EXPECT_EQ(PREFIX(gztell)(file), pos);
    EXPECT_EQ(PREFIX(gzgetc)(file), ' ');
    EXPECT_EQ(PREFIX(gzungetc)(' ', file), ' ');
    /* Read first hello, hello! string with gzgets */
    strcpy((char*)uncompr, "garbages");
    PREFIX(gzgets)(file, (char*)uncompr, (int)uncompr_len);
    EXPECT_EQ(strlen((char*)uncompr), 7UL); /* " hello!" */
    EXPECT_STREQ((char*)uncompr, hello + 6);

    /* Seek to second hello, hello! string */
    pos = PREFIX(gzseek)(file, 14L, SEEK_SET);
    EXPECT_EQ(pos, 14);
    EXPECT_EQ(PREFIX(gztell)(file), pos);

    /* Check position not at end of file */
    EXPECT_EQ(PREFIX(gzeof)(file), 0);
    /* Read first hello, hello! string with gzfread */
    strcpy((char*)uncompr, "garbages");
    read = PREFIX(gzfread)(uncompr, uncompr_len, 1, file);
    EXPECT_STREQ((const char *)uncompr, hello);

    pos = PREFIX(gzoffset)(file);
    EXPECT_GE(pos, 0);
    EXPECT_EQ(pos, (compr_len + 10));

    /* Trigger an error and clear it with gzclearerr */
    PREFIX(gzfread)(uncompr, (size_t)-1, (size_t)-1, file);
    PREFIX(gzerror)(file, &err);
    EXPECT_NE(err, 0);

    PREFIX(gzclearerr)(file);
    PREFIX(gzerror)(file, &err);
    EXPECT_EQ(err, 0);

    PREFIX(gzclose)(file);

    EXPECT_EQ(PREFIX(gzclose)(NULL), Z_STREAM_ERROR);
    Z_UNUSED(read);
#endif
}